

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_connectionErrorNoComponent2_Test::TestBody(Parser_connectionErrorNoComponent2_Test *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_1098;
  allocator_type local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  allocator<char> local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  string local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  string in;
  ParserPtr p;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelA\">\n  <component name=\"componentA\">\n    <variable name=\"variable1\" units=\"dimensionless\"/>\n  </component>\n  <connection component_1=\"component1\">\n    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n  </connection>\n</model>\n"
             ,(allocator<char> *)&p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,
             "Connection in model \'modelA\' does not specify a component_2 in a connection element."
             ,local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Connection in model \'modelA\' specifies \'component1\' as component_1 but it does not exist in the model."
             ,(allocator<char> *)&gtest_trace_1098);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,
             "Connection in model \'modelA\' specifies \'variable1\' as variable_1 but the corresponding component_1 is invalid."
             ,&local_f1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "Connection in model \'modelA\' specifies \'variable2\' as variable_2 but the corresponding component_2 is invalid."
             ,&local_f2);
  __l._M_len = 4;
  __l._M_array = (iterator)&p;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,&local_f3);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  libcellml::Parser::create(SUB81(&p,0));
  libcellml::Parser::parseModel(local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_1098,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
             ,0x44a,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Parser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)local_f0,
             &p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_1098);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Parser, connectionErrorNoComponent2)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelA\">\n"
        "  <component name=\"componentA\">\n"
        "    <variable name=\"variable1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Connection in model 'modelA' does not specify a component_2 in a connection element.",
        "Connection in model 'modelA' specifies 'component1' as component_1 but it does not exist in the model.",
        "Connection in model 'modelA' specifies 'variable1' as variable_1 but the corresponding component_1 is invalid.",
        "Connection in model 'modelA' specifies 'variable2' as variable_2 but the corresponding component_2 is invalid.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);

    EXPECT_EQ_ISSUES(expectedIssues, p);
}